

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::(anonymous_namespace)::SiPrint_abi_cxx11_(int64_t size,bool force_sign)

{
  byte in_DL;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string ret;
  double size_d;
  size_t n;
  size_t num_prefixes;
  char *prefixes [5];
  double in_stack_00000230;
  char *in_stack_00000238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1f0 [32];
  string local_1d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  double local_60;
  ulong local_58;
  undefined8 local_50;
  undefined1 local_48 [55];
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  __lhs = in_RDI;
  local_10 = in_RSI;
  memcpy(local_48,&DAT_00888840,0x28);
  local_50 = 5;
  local_58 = 0;
  for (local_60 = (double)local_10; 1024.0 < ABS(local_60) && local_58 < 3;
      local_60 = local_60 / 1024.0) {
    local_58 = local_58 + 1;
  }
  std::__cxx11::string::string(local_80);
  if ((100.0 < ABS(local_60)) || (local_58 == 0)) {
    std::__cxx11::to_string((long)in_stack_fffffffffffffe48);
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::operator=(local_80,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    if (((local_11 & 1) != 0) && (0 < local_10)) {
      std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      std::__cxx11::string::operator=(local_80,local_f0);
      std::__cxx11::string::~string(local_f0);
    }
  }
  else if (ABS(local_60) <= 10.0) {
    if ((local_11 & 1) == 0) {
      DoubleStringPrintf_abi_cxx11_(in_stack_00000238,in_stack_00000230);
      std::operator+(__lhs,(char *)in_RDI);
      std::__cxx11::string::operator=(local_80,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
    }
    else {
      DoubleStringPrintf_abi_cxx11_(in_stack_00000238,in_stack_00000230);
      std::operator+(__lhs,(char *)in_RDI);
      std::__cxx11::string::operator=(local_80,local_190);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
    }
  }
  else if ((local_11 & 1) == 0) {
    DoubleStringPrintf_abi_cxx11_(in_stack_00000238,in_stack_00000230);
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::operator=(local_80,local_150);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
  }
  else {
    DoubleStringPrintf_abi_cxx11_(in_stack_00000238,in_stack_00000230);
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::operator=(local_80,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
  }
  anon_unknown_33::LeftPad(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_80);
  return __lhs;
}

Assistant:

std::string SiPrint(int64_t size, bool force_sign) {
  const char* prefixes[] = {"", "Ki", "Mi", "Gi", "Ti"};
  size_t num_prefixes = 5;
  size_t n = 0;
  double size_d = size;
  while (fabs(size_d) > 1024 && n < num_prefixes - 2) {
    size_d /= 1024;
    n++;
  }

  std::string ret;

  if (fabs(size_d) > 100 || n == 0) {
    ret = std::to_string(static_cast<int64_t>(size_d)) + prefixes[n];
    if (force_sign && size > 0) {
      ret = "+" + ret;
    }
  } else if (fabs(size_d) > 10) {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.1f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.1f", size_d) + prefixes[n];
    }
  } else {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.2f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.2f", size_d) + prefixes[n];
    }
  }

  return LeftPad(ret, 7);
}